

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multitexturedmesh.cc
# Opt level: O0

void __thiscall gvr::MultiTexturedMesh::MultiTexturedMesh(MultiTexturedMesh *this)

{
  Mesh *in_RDI;
  
  Mesh::Mesh(in_RDI);
  (in_RDI->super_PointCloud).super_Model._vptr_Model =
       (_func_int **)&PTR__MultiTexturedMesh_0016aac8;
  std::__cxx11::string::string((string *)(in_RDI + 1));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x153848);
  in_RDI[1].super_PointCloud.super_Model.Rc.v[0][2] = 0.0;
  return;
}

Assistant:

MultiTexturedMesh::MultiTexturedMesh()
{
  uvt=0;
}